

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O1

void __thiscall soul::Structure::addMember(Structure *this,Type *type,string *memberName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type mVar2;
  bool bVar3;
  mapped_type *pmVar4;
  string_view memberName_00;
  Structure *local_90;
  undefined1 local_88 [16];
  StructurePtr local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  ReadWriteCount local_50;
  Type local_48;
  
  memberName_00._M_str = (memberName->_M_dataplus)._M_p;
  memberName_00._M_len = memberName->_M_string_length;
  bVar3 = hasMemberWithName(this,memberName_00);
  if (bVar3) {
    throwInternalCompilerError("! hasMemberWithName (memberName)","addMember",0x2a);
  }
  if (type->category == structure) {
    Type::getStruct((Type *)&local_90);
    if (local_90 == (Structure *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x47);
    }
    local_48.category = structure;
    local_48.arrayElementCategory = invalid;
    local_48.isRef = false;
    local_48.isConstant = false;
    local_48.primitiveType.type = invalid;
    local_48.boundingSize._0_1_ = 0;
    local_48._9_7_ = 0;
    (this->super_RefCountedObject).refCount = (this->super_RefCountedObject).refCount + 1;
    local_48.structure.object = this;
    bVar3 = containsMemberOfType(local_90,&local_48,true);
    if (bVar3) {
      throwInternalCompilerError
                ("! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true))"
                 ,"addMember",0x2d);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_90);
  }
  mVar2 = (this->members).numActive;
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->memberIndexMap,memberName);
  *pmVar4 = mVar2;
  local_88[0] = type->category;
  local_88[1] = type->arrayElementCategory;
  local_88[2] = type->isRef;
  local_88[3] = type->isConstant;
  local_88._4_4_ = (type->primitiveType).type;
  local_88._8_8_ = *(undefined8 *)&type->boundingSize;
  local_78.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  local_70._M_p = (memberName->_M_dataplus)._M_p;
  paVar1 = &memberName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p == paVar1) {
    local_60._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60._8_8_ = *(undefined8 *)((long)&memberName->field_2 + 8);
    local_70._M_p = (pointer)&local_60;
  }
  else {
    local_60._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68 = memberName->_M_string_length;
  (memberName->_M_dataplus)._M_p = (pointer)paVar1;
  memberName->_M_string_length = 0;
  (memberName->field_2)._M_local_buf[0] = '\0';
  local_50.numReads = 0;
  local_50.numWrites = 0;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::push_back(&this->members,(Member *)local_88)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_78.object);
  return;
}

Assistant:

void Structure::addMember (Type type, std::string memberName)
{
    SOUL_ASSERT (! hasMemberWithName (memberName));

    // Ensure we won't create a recursive structure (one containing itself) if we add a member of this type
    SOUL_ASSERT (! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true)));

    memberIndexMap[memberName] = members.size();
    members.push_back ({ std::move (type), std::move (memberName) });

}